

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt5
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  uint i_00;
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  byte local_59c;
  byte local_598;
  byte local_594;
  byte local_590;
  ushort local_588;
  ushort local_584;
  ulong local_568;
  uint64 s_1;
  uint64 error;
  uint values [8];
  uint local_528;
  ushort local_524;
  uint8 H_1;
  uint8 L_1;
  uint i_1;
  uint16 H;
  uint16 L;
  uint8 maxH;
  uint8 minH;
  uint8 maxL;
  uint8 minL;
  uint solutions_count;
  uint16 solutions [529];
  uint8 s;
  uint8 a;
  uint i;
  uint c;
  uint64 DD [8];
  uint64 D2 [8];
  uint64 hist [8];
  uint8 H0;
  uint8 L0;
  vec3F *high_color_local;
  vec3F *low_color_local;
  dxt_endpoint_refiner *this_local;
  
  pfVar5 = vec<3U,_float>::operator[](low_color,0);
  iVar3 = math::clamp<int>((int)(*pfVar5 * 256.0),0,0xff);
  hist[7]._7_1_ = (byte)iVar3;
  pfVar5 = vec<3U,_float>::operator[](high_color,0);
  iVar4 = math::clamp<int>((int)(*pfVar5 * 256.0),0,0xff);
  hist[7]._6_1_ = (byte)iVar4;
  memset(D2 + 7,0,0x40);
  memset(DD + 7,0,0x40);
  memset(&i,0,0x40);
  i_00 = this->m_pParams->m_alpha_comp_index;
  for (stack0xffffffffffffff10 = 0; stack0xffffffffffffff10 < this->m_pParams->m_num_pixels;
      stack0xffffffffffffff10 = stack0xffffffffffffff10 + 1) {
    solutions[0x20f]._1_1_ =
         color_quad<unsigned_char,_int>::operator[]
                   (this->m_pParams->m_pPixels + stack0xffffffffffffff10,i_00);
    solutions[0x20f]._0_1_ = this->m_pParams->m_pSelectors[stack0xffffffffffffff10];
    D2[(ulong)(byte)solutions[0x20f] + 7] = D2[(ulong)(byte)solutions[0x20f] + 7] + 1;
    DD[(ulong)(byte)solutions[0x20f] + 7] =
         (long)(int)((uint)solutions[0x20f]._1_1_ << 1) + DD[(ulong)(byte)solutions[0x20f] + 7];
    *(long *)(&i + (ulong)(byte)solutions[0x20f] * 2) =
         (long)(int)((uint)solutions[0x20f]._1_1_ * (uint)solutions[0x20f]._1_1_) +
         *(long *)(&i + (ulong)(byte)solutions[0x20f] * 2);
  }
  if (hist[7]._7_1_ == hist[7]._6_1_) {
    if (hist[7]._6_1_ == 0) {
      local_584 = 1;
    }
    else {
      local_584 = (((ushort)iVar4 & 0xff) - 1) * 0x100 | (ushort)iVar3 & 0xff;
    }
    local_588 = local_584;
  }
  else {
    local_588 = hist[7]._6_2_;
    if (hist[7]._6_1_ < hist[7]._7_1_) {
      local_588 = CONCAT11(hist[7]._6_1_,hist[7]._7_1_);
    }
  }
  _H = 1;
  _maxH = local_588;
  if (hist[7]._7_1_ < 0xc) {
    local_590 = 0;
  }
  else {
    local_590 = hist[7]._7_1_ - 0xb;
  }
  if (hist[7]._7_1_ < 0xf4) {
    local_594 = hist[7]._7_1_ + 0xb;
  }
  else {
    local_594 = 0xff;
  }
  if (hist[7]._6_1_ < 0xc) {
    local_598 = 0;
  }
  else {
    local_598 = hist[7]._6_1_ - 0xb;
  }
  if (hist[7]._6_1_ < 0xf4) {
    local_59c = hist[7]._6_1_ + 0xb;
  }
  else {
    local_59c = 0xff;
  }
  for (_H_1 = (ushort)local_590; _H_1 <= local_594; _H_1 = _H_1 + 1) {
    for (local_524 = (ushort)local_598; local_524 <= local_59c; local_524 = local_524 + 1) {
      if ((((local_59c < _H_1) || (_H_1 <= local_524)) || (local_524 < local_590)) &&
         (((_H_1 != hist[7]._7_1_ || (local_524 != hist[7]._6_1_)) &&
          ((_H_1 != hist[7]._6_1_ || (local_524 != hist[7]._7_1_)))))) {
        if (_H_1 == local_524) {
          if (local_524 == 0) {
            uVar2 = 1;
          }
          else {
            uVar2 = (local_524 - 1) * 0x100 | _H_1;
          }
        }
        else if (local_524 < _H_1) {
          uVar2 = local_524 << 8 | _H_1;
        }
        else {
          uVar2 = _H_1 << 8 | local_524;
        }
        *(ushort *)(&maxH + (ulong)_H * 2) = uVar2;
        _H = _H + 1;
      }
    }
  }
  local_528 = 0;
  do {
    if (_H <= local_528) {
      return;
    }
    uVar2 = *(ushort *)(&maxH + (ulong)local_528 * 2);
    bVar1 = (byte)((ushort)*(undefined2 *)(&maxH + (ulong)local_528 * 2) >> 8);
    dxt5_block::get_block_values8((uint *)&error,(uint)(byte)uVar2,(uint)bVar1);
    s_1 = 0;
    for (local_568 = 0; local_568 < 8; local_568 = local_568 + 1) {
      s_1 = (D2[local_568 + 7] * (ulong)values[local_568 - 2] * (ulong)values[local_568 - 2] -
            DD[local_568 + 7] * (ulong)values[local_568 - 2]) + *(long *)(&i + local_568 * 2) + s_1;
    }
    if (s_1 < this->m_pResults->m_error) {
      this->m_pResults->m_low_color = uVar2 & 0xff;
      this->m_pResults->m_high_color = (ushort)bVar1;
      this->m_pResults->m_error = s_1;
      if (this->m_pResults->m_error == 0) {
        return;
      }
    }
    local_528 = local_528 + 1;
  } while( true );
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt5(vec3F low_color, vec3F high_color)
    {
        uint8 L0 = math::clamp<int>(low_color[0] * 256.0f, 0, 255);
        uint8 H0 = math::clamp<int>(high_color[0] * 256.0f, 0, 255);

        uint64 hist[8] = {}, D2[8] = {}, DD[8] = {};
        for (uint c = m_pParams->m_alpha_comp_index, i = 0; i < m_pParams->m_num_pixels; i++)
        {
            uint8 a = m_pParams->m_pPixels[i][c];
            uint8 s = m_pParams->m_pSelectors[i];
            hist[s]++;
            D2[s] += a * 2;
            DD[s] += a * a;
        }

        uint16 solutions[529];
        uint solutions_count = 0;
        solutions[solutions_count++] = L0 == H0 ? H0 ? H0 - 1 << 8 | L0 : 1 : L0 > H0 ? H0 << 8 | L0
                                                                                      : L0 << 8 | H0;
        uint8 minL = L0 <= 11 ? 0 : L0 - 11, maxL = L0 >= 244 ? 255 : L0 + 11;
        uint8 minH = H0 <= 11 ? 0 : H0 - 11, maxH = H0 >= 244 ? 255 : H0 + 11;
        for (uint16 L = minL; L <= maxL; L++)
        {
            for (uint16 H = minH; H <= maxH; H++)
            {
                if ((maxH < L || L <= H || H < minL) && (L != L0 || H != H0) && (L != H0 || H != L0))
                {
                    solutions[solutions_count++] = L == H ? H ? H - 1 << 8 | L : 1 : L > H ? H << 8 | L
                                                                                           : L << 8 | H;
                }
            }
        }

        for (uint i = 0; i < solutions_count; i++)
        {
            uint8 L = solutions[i] & 0xFF;
            uint8 H = solutions[i] >> 8;
            uint values[8];
            dxt5_block::get_block_values8(values, L, H);
            uint64 error = 0;
            for (uint64 s = 0; s < 8; s++)
            {
                error += hist[s] * values[s] * values[s] - D2[s] * values[s] + DD[s];
            }
            if (error < m_pResults->m_error)
            {
                m_pResults->m_low_color = L;
                m_pResults->m_high_color = H;
                m_pResults->m_error = error;
                if (!m_pResults->m_error)
                {
                    return;
                }
            }
        }
    }